

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.cpp
# Opt level: O2

void __thiscall
bal::CnfL0Index::rollback
          (CnfL0Index *this,container_size_t size,container_size_t instances_size,
          container_size_t container_size)

{
  uint *p_object;
  uint container_offset;
  insertion_point_t insertion_point;
  
  ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  ::rollback((ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              *)this,size,instances_size,container_size);
  (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>.
  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  .super_Container<bal::avl_tree_index_item_t>.size_ = 0;
  (this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
  super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>.
  super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
  .instances_.size_ = 0;
  Container<unsigned_int>::append
            (&(this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
              super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
              .
              super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
              .instances_,0xffffffff,instances_size);
  container_offset = 0;
  while( true ) {
    if (container_size <= container_offset) {
      return;
    }
    p_object = ((this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>).
                super_BinaryTreesIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>
                .
                super_ContainerIndex<bal::avl_tree_index_item_t,_unsigned_int,_bal::BinaryTreesIndexInstanceOffsetIterator<bal::avl_tree_index_item_t,_unsigned_int,_bal::avl_tree_insertion_point_t>,_bal::avl_tree_insertion_point_t>
               .container_)->data_ + container_offset;
    AvlTreesIndex<unsigned_int,_&bal::compare_clauses>::find
              (&this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>,
               (p_object[1] >> 1) - 1,p_object,&insertion_point);
    if (insertion_point.super_container_index_insertion_point_t.container_offset != 0xffffffff)
    break;
    AvlTreesIndex<unsigned_int,_&bal::compare_clauses>::append
              (&this->super_AvlTreesIndex<unsigned_int,_&bal::compare_clauses>,&insertion_point,
               container_offset);
    container_offset = container_offset + (ushort)*p_object + 1;
  }
  __assert_fail("offset_found == CONTAINER_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.cpp"
                ,0x22,
                "virtual void bal::CnfL0Index::rollback(const container_size_t, const container_size_t, const container_size_t)"
               );
}

Assistant:

void CnfL0Index::rollback(const container_size_t size,
                          const container_size_t instances_size,
                          const container_size_t container_size) {
        base_t::rollback(size, instances_size, container_size);
        this->size_ = 0;
        this->instances_.size_ = 0;
        this->instances_.append(CONTAINER_END, instances_size);
        container_offset_t container_offset = 0;
        while (container_offset < container_size) {
            const uint32_t* const p_clause = this->container_.data_ + container_offset;            
            insertion_point_t insertion_point;
            this->find(literal_t__variable_id(_clause_literal(p_clause, 0)), p_clause, insertion_point);
            container_offset_t offset_found = insertion_point.container_offset;
            assert(offset_found == CONTAINER_END);
            this->append(insertion_point, container_offset);
            container_offset += _clause_size(p_clause) + 1;
        };
    }